

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ocs_test.cc
# Opt level: O0

int test_describe_monitor_values(void)

{
  code *pcVar1;
  char *__s;
  OcsDescribeMonitorValuesRequestType *pOVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_1e1;
  int ret;
  HttpTestListener *local_1c0;
  HttpTestListener *listener;
  string local_1b0;
  allocator<char> local_189;
  string local_188 [39];
  allocator<char> local_161;
  string local_160 [55];
  allocator<char> local_129;
  string local_128 [32];
  OcsDescribeMonitorValuesRequestType *local_108;
  Ocs *ocs;
  OcsDescribeMonitorValuesResponseType resp;
  OcsDescribeMonitorValuesRequestType req;
  
  aliyun::OcsDescribeMonitorValuesRequestType::OcsDescribeMonitorValuesRequestType
            ((OcsDescribeMonitorValuesRequestType *)((long)&resp.date.field_2 + 8));
  aliyun::OcsDescribeMonitorValuesResponseType::OcsDescribeMonitorValuesResponseType
            ((OcsDescribeMonitorValuesResponseType *)&ocs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_128,"cn-hangzhou",&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_160,"my_appid",&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_188,"my_secret",&local_189);
  pOVar2 = (OcsDescribeMonitorValuesRequestType *)
           aliyun::Ocs::CreateOcsClient(local_128,local_160,local_188);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator(&local_189);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator(&local_161);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  local_108 = pOVar2;
  if (pOVar2 == (OcsDescribeMonitorValuesRequestType *)0x0) {
    aliyun::OcsDescribeMonitorValuesResponseType::~OcsDescribeMonitorValuesResponseType
              ((OcsDescribeMonitorValuesResponseType *)&ocs);
    aliyun::OcsDescribeMonitorValuesRequestType::~OcsDescribeMonitorValuesRequestType
              ((OcsDescribeMonitorValuesRequestType *)((long)&resp.date.field_2 + 8));
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Ocs::SetProxyHost((Ocs *)pOVar2,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Ocs::SetUseTls((Ocs *)local_108,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_describe_monitor_values_response;
  local_1c0 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_1e1);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_1e1);
  HttpTestListener::Start(local_1c0);
  std::__cxx11::string::operator=((string *)(resp.date.field_2._M_local_buf + 8),"OwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.owner_id.field_2._M_local_buf + 8),"ResourceOwnerAccount");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_account.field_2._M_local_buf + 8),"ResourceOwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_id.field_2._M_local_buf + 8),"OwnerAccount");
  std::__cxx11::string::operator=
            ((string *)(req.owner_account.field_2._M_local_buf + 8),"InstanceIds");
  std::__cxx11::string::operator=
            ((string *)(req.instance_ids.field_2._M_local_buf + 8),"MonitorKeys");
  aliyun::Ocs::DescribeMonitorValues
            (local_108,(OcsDescribeMonitorValuesResponseType *)((long)&resp.date.field_2 + 8),
             (OcsErrorInfo *)&ocs);
  HttpTestListener::WaitComplete(local_1c0);
  pHVar3 = local_1c0;
  if (local_1c0 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_1c0);
    operator_delete(pHVar3,0x180);
  }
  pOVar2 = local_108;
  if (local_108 != (OcsDescribeMonitorValuesRequestType *)0x0) {
    aliyun::Ocs::~Ocs((Ocs *)local_108);
    operator_delete(pOVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_describe_monitor_values() {
  OcsDescribeMonitorValuesRequestType req;
  OcsDescribeMonitorValuesResponseType resp;
  Ocs* ocs = Ocs::CreateOcsClient("cn-hangzhou", "my_appid", "my_secret");
  if(!ocs) return 0;
  ocs->SetProxyHost("127.0.0.1:12234");
  ocs->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_describe_monitor_values_response);
  listener->Start();
  req.owner_id = "OwnerId";
  req.resource_owner_account = "ResourceOwnerAccount";
  req.resource_owner_id = "ResourceOwnerId";
  req.owner_account = "OwnerAccount";
  req.instance_ids = "InstanceIds";
  req.monitor_keys = "MonitorKeys";
  int ret = ocs->DescribeMonitorValues(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete ocs;
}